

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char,_char[25]>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char,char_const[25]>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char,_char[25]>
           *__return_storage_ptr__,v10 *this,uchar *args,char (*args_1) [25])

{
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  char (*args_local_1) [25];
  uchar *args_local;
  size_t local_70;
  size_t local_30;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  
  args_local._0_4_ = (uint)(byte)*this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.data = (char *)args_local;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_70;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = (char *)args;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_30;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}